

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTransaction::PushAppend
          (DuckTransaction *this,DataTable *table,idx_t start_row,idx_t row_count)

{
  data_ptr_t pdVar1;
  UndoBufferReference undo_entry;
  
  ModifyTable(this,table);
  UndoBuffer::CreateEntry(&undo_entry,&this->undo_buffer,INSERT_TUPLE,0x18);
  pdVar1 = UndoBufferReference::Ptr(&undo_entry);
  *(DataTable **)pdVar1 = table;
  *(idx_t *)(pdVar1 + 8) = start_row;
  *(idx_t *)(pdVar1 + 0x10) = row_count;
  BufferHandle::~BufferHandle(&undo_entry.handle);
  return;
}

Assistant:

void DuckTransaction::PushAppend(DataTable &table, idx_t start_row, idx_t row_count) {
	ModifyTable(table);
	auto undo_entry = undo_buffer.CreateEntry(UndoFlags::INSERT_TUPLE, sizeof(AppendInfo));
	auto append_info = reinterpret_cast<AppendInfo *>(undo_entry.Ptr());
	append_info->table = &table;
	append_info->start_row = start_row;
	append_info->count = row_count;
}